

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

void Abc_GraphPathPrint5(int *pBuffer,Vec_Int_t *vEdges)

{
  uint uVar1;
  uint uVar2;
  undefined1 *puVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  uint uVar9;
  long lVar10;
  undefined1 uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar19;
  int iVar20;
  undefined1 auVar17 [16];
  int iVar21;
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar42;
  int iVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  char Box [17] [17];
  undefined1 local_158;
  undefined1 local_157 [271];
  undefined1 local_48 [24];
  long lVar41;
  
  puVar8 = &local_158;
  uVar1 = vEdges->nSize;
  puVar3 = local_157;
  lVar5 = 0;
  do {
    lVar10 = 0;
    auVar33 = _DAT_0094e240;
    do {
      auVar43 = auVar33 ^ _DAT_0094e250;
      auVar48._0_4_ = -(uint)(auVar43._0_4_ < -0x7fffffef);
      auVar48._4_4_ = -(uint)(auVar43._4_4_ < -0x80000000);
      auVar48._8_4_ = -(uint)(auVar43._8_4_ < -0x7fffffef);
      iVar16 = auVar43._12_4_;
      auVar48._12_4_ = -(uint)(iVar16 < -0x80000000);
      auVar43._0_4_ = -(uint)(auVar43._4_4_ == -0x80000000);
      auVar43._4_4_ = 0;
      auVar43._8_4_ = -(uint)(iVar16 == -0x80000000);
      auVar43._12_4_ = -(uint)(iVar16 == -0x80000000);
      if ((auVar43 & auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar11 = 0x20;
        if ((((uint)lVar10 | (uint)lVar5) & 3) == 0) {
          uVar11 = 0x2a;
        }
        puVar3[lVar10 + -1] = uVar11;
      }
      if ((auVar43 & auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar3[lVar10] = 0x20;
      }
      lVar10 = lVar10 + 2;
      lVar41 = auVar33._8_8_;
      auVar33._0_8_ = auVar33._0_8_ + 2;
      auVar33._8_8_ = lVar41 + 2;
    } while (lVar10 != 0x12);
    lVar5 = lVar5 + 1;
    puVar3 = puVar3 + 0x11;
  } while (lVar5 != 0x11);
  if (1 < (int)uVar1) {
    uVar12 = 0;
    auVar33 = _DAT_0094e250;
    auVar43 = _DAT_009c8570;
    auVar53 = _DAT_009c8580;
    auVar54 = _DAT_009c8590;
    auVar55 = _DAT_009c85a0;
    auVar56 = _DAT_009c85b0;
    auVar57 = _DAT_009c85c0;
    auVar58 = _DAT_0094f530;
    do {
      if ((ulong)uVar1 <= uVar12 * 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if (pBuffer[uVar12] != 0) {
        iVar16 = vEdges->pArray[uVar12 * 2];
        uVar2 = (iVar16 / 5) * 4;
        uVar6 = (iVar16 % 5) * 4;
        iVar16 = vEdges->pArray[uVar12 * 2 + 1];
        uVar9 = (iVar16 / 5) * 4;
        uVar4 = (iVar16 % 5) * 4;
        if (uVar2 == uVar9) {
          if ((int)(uVar6 | 1) < (int)uVar4) {
            memset(local_157 + (long)(int)uVar6 + (long)(int)uVar2 * 0x11,0x2d,
                   (ulong)(~uVar6 + uVar4));
            auVar33 = _DAT_0094e250;
            auVar43 = _DAT_009c8570;
            auVar53 = _DAT_009c8580;
            auVar54 = _DAT_009c8590;
            auVar55 = _DAT_009c85a0;
            auVar56 = _DAT_009c85b0;
            auVar57 = _DAT_009c85c0;
            auVar58 = _DAT_0094f530;
          }
        }
        else {
          if (uVar6 != uVar4) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPath.c"
                          ,0xf7,"void Abc_GraphPathPrint5(int *, Vec_Int_t *)");
          }
          if ((int)(uVar2 | 1) < (int)uVar9) {
            lVar5 = (long)(int)uVar9 + (long)(int)~uVar2 + -1;
            auVar13._8_4_ = (int)lVar5;
            auVar13._0_8_ = lVar5;
            auVar13._12_4_ = (int)((ulong)lVar5 >> 0x20);
            puVar3 = local_48 + (long)(int)uVar2 * 0x11 + (long)(int)uVar6;
            uVar7 = 0;
            do {
              auVar14._8_4_ = (int)uVar7;
              auVar14._0_8_ = uVar7;
              auVar14._12_4_ = (int)(uVar7 >> 0x20);
              auVar17 = auVar13 ^ auVar33;
              auVar22 = (auVar14 | _DAT_0094e240) ^ auVar33;
              iVar16 = auVar17._0_4_;
              iVar42 = -(uint)(iVar16 < auVar22._0_4_);
              iVar19 = auVar17._4_4_;
              auVar23._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
              iVar20 = auVar17._8_4_;
              iVar47 = -(uint)(iVar20 < auVar22._8_4_);
              iVar21 = auVar17._12_4_;
              auVar23._12_4_ = -(uint)(iVar21 < auVar22._12_4_);
              auVar34._4_4_ = iVar42;
              auVar34._0_4_ = iVar42;
              auVar34._8_4_ = iVar47;
              auVar34._12_4_ = iVar47;
              auVar48 = pshuflw(auVar48,auVar34,0xe8);
              auVar17._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
              auVar17._12_4_ = -(uint)(auVar22._12_4_ == iVar21);
              auVar17._0_4_ = auVar17._4_4_;
              auVar17._8_4_ = auVar17._12_4_;
              auVar49 = pshuflw(in_XMM7,auVar17,0xe8);
              auVar23._0_4_ = auVar23._4_4_;
              auVar23._8_4_ = auVar23._12_4_;
              auVar22 = pshuflw(auVar48,auVar23,0xe8);
              auVar50._8_4_ = 0xffffffff;
              auVar50._0_8_ = 0xffffffffffffffff;
              auVar50._12_4_ = 0xffffffff;
              auVar48 = (auVar22 | auVar49 & auVar48) ^ auVar50;
              auVar48 = packssdw(auVar48,auVar48);
              if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar3[-0xff] = 0x7c;
              }
              auVar23 = auVar17 & auVar34 | auVar23;
              auVar48 = packssdw(auVar23,auVar23);
              auVar48 = packssdw(auVar48 ^ auVar50,auVar48 ^ auVar50);
              auVar48 = packsswb(auVar48,auVar48);
              if ((auVar48._0_4_ >> 8 & 1) != 0) {
                puVar3[-0xee] = 0x7c;
              }
              auVar48 = (auVar14 | auVar58) ^ auVar33;
              iVar42 = -(uint)(iVar16 < auVar48._0_4_);
              auVar44._4_4_ = -(uint)(iVar19 < auVar48._4_4_);
              iVar47 = -(uint)(iVar20 < auVar48._8_4_);
              auVar44._12_4_ = -(uint)(iVar21 < auVar48._12_4_);
              auVar22._4_4_ = iVar42;
              auVar22._0_4_ = iVar42;
              auVar22._8_4_ = iVar47;
              auVar22._12_4_ = iVar47;
              auVar49._4_4_ = -(uint)(auVar48._4_4_ == iVar19);
              auVar49._12_4_ = -(uint)(auVar48._12_4_ == iVar21);
              auVar49._0_4_ = auVar49._4_4_;
              auVar49._8_4_ = auVar49._12_4_;
              auVar44._0_4_ = auVar44._4_4_;
              auVar44._8_4_ = auVar44._12_4_;
              auVar48 = auVar49 & auVar22 | auVar44;
              auVar48 = packssdw(auVar48,auVar48);
              auVar48 = packssdw(auVar48 ^ auVar50,auVar48 ^ auVar50);
              auVar48 = packsswb(auVar48,auVar48);
              if ((auVar48._0_4_ >> 0x10 & 1) != 0) {
                puVar3[-0xdd] = 0x7c;
              }
              auVar17 = pshufhw(auVar22,auVar22,0x84);
              auVar23 = pshufhw(auVar49,auVar49,0x84);
              auVar22 = pshufhw(auVar17,auVar44,0x84);
              auVar17 = (auVar22 | auVar23 & auVar17) ^ auVar50;
              auVar17 = packssdw(auVar17,auVar17);
              auVar17 = packsswb(auVar17,auVar17);
              if ((auVar17._0_4_ >> 0x18 & 1) != 0) {
                puVar3[-0xcc] = 0x7c;
              }
              auVar17 = (auVar14 | auVar57) ^ auVar33;
              iVar42 = -(uint)(iVar16 < auVar17._0_4_);
              auVar25._4_4_ = -(uint)(iVar19 < auVar17._4_4_);
              iVar47 = -(uint)(iVar20 < auVar17._8_4_);
              auVar25._12_4_ = -(uint)(iVar21 < auVar17._12_4_);
              auVar35._4_4_ = iVar42;
              auVar35._0_4_ = iVar42;
              auVar35._8_4_ = iVar47;
              auVar35._12_4_ = iVar47;
              auVar48 = pshuflw(auVar48,auVar35,0xe8);
              auVar24._4_4_ = -(uint)(auVar17._4_4_ == iVar19);
              auVar24._12_4_ = -(uint)(auVar17._12_4_ == iVar21);
              auVar24._0_4_ = auVar24._4_4_;
              auVar24._8_4_ = auVar24._12_4_;
              auVar22 = pshuflw(auVar50,auVar24,0xe8);
              auVar25._0_4_ = auVar25._4_4_;
              auVar25._8_4_ = auVar25._12_4_;
              auVar17 = pshuflw(auVar48,auVar25,0xe8);
              auVar51._8_4_ = 0xffffffff;
              auVar51._0_8_ = 0xffffffffffffffff;
              auVar51._12_4_ = 0xffffffff;
              auVar48 = (auVar17 | auVar22 & auVar48) ^ auVar51;
              auVar48 = packssdw(auVar48,auVar48);
              auVar48 = packsswb(auVar48,auVar48);
              if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar3[-0xbb] = 0x7c;
              }
              auVar25 = auVar24 & auVar35 | auVar25;
              auVar48 = packssdw(auVar25,auVar25);
              auVar48 = packssdw(auVar48 ^ auVar51,auVar48 ^ auVar51);
              auVar48 = packsswb(auVar48,auVar48);
              if ((auVar48._4_2_ >> 8 & 1) != 0) {
                puVar3[-0xaa] = 0x7c;
              }
              auVar48 = (auVar14 | auVar56) ^ auVar33;
              iVar42 = -(uint)(iVar16 < auVar48._0_4_);
              auVar45._4_4_ = -(uint)(iVar19 < auVar48._4_4_);
              iVar47 = -(uint)(iVar20 < auVar48._8_4_);
              auVar45._12_4_ = -(uint)(iVar21 < auVar48._12_4_);
              auVar26._4_4_ = iVar42;
              auVar26._0_4_ = iVar42;
              auVar26._8_4_ = iVar47;
              auVar26._12_4_ = iVar47;
              auVar36._4_4_ = -(uint)(auVar48._4_4_ == iVar19);
              auVar36._12_4_ = -(uint)(auVar48._12_4_ == iVar21);
              auVar36._0_4_ = auVar36._4_4_;
              auVar36._8_4_ = auVar36._12_4_;
              auVar45._0_4_ = auVar45._4_4_;
              auVar45._8_4_ = auVar45._12_4_;
              auVar48 = auVar36 & auVar26 | auVar45;
              auVar48 = packssdw(auVar48,auVar48);
              auVar48 = packssdw(auVar48 ^ auVar51,auVar48 ^ auVar51);
              auVar48 = packsswb(auVar48,auVar48);
              if ((auVar48 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar3[-0x99] = 0x7c;
              }
              auVar17 = pshufhw(auVar26,auVar26,0x84);
              auVar23 = pshufhw(auVar36,auVar36,0x84);
              auVar22 = pshufhw(auVar17,auVar45,0x84);
              auVar17 = (auVar22 | auVar23 & auVar17) ^ auVar51;
              auVar17 = packssdw(auVar17,auVar17);
              auVar17 = packsswb(auVar17,auVar17);
              if ((auVar17._6_2_ >> 8 & 1) != 0) {
                puVar3[-0x88] = 0x7c;
              }
              auVar17 = (auVar14 | auVar55) ^ auVar33;
              iVar42 = -(uint)(iVar16 < auVar17._0_4_);
              auVar28._4_4_ = -(uint)(iVar19 < auVar17._4_4_);
              iVar47 = -(uint)(iVar20 < auVar17._8_4_);
              auVar28._12_4_ = -(uint)(iVar21 < auVar17._12_4_);
              auVar37._4_4_ = iVar42;
              auVar37._0_4_ = iVar42;
              auVar37._8_4_ = iVar47;
              auVar37._12_4_ = iVar47;
              auVar48 = pshuflw(auVar48,auVar37,0xe8);
              auVar27._4_4_ = -(uint)(auVar17._4_4_ == iVar19);
              auVar27._12_4_ = -(uint)(auVar17._12_4_ == iVar21);
              auVar27._0_4_ = auVar27._4_4_;
              auVar27._8_4_ = auVar27._12_4_;
              auVar22 = pshuflw(auVar51,auVar27,0xe8);
              auVar28._0_4_ = auVar28._4_4_;
              auVar28._8_4_ = auVar28._12_4_;
              auVar17 = pshuflw(auVar48,auVar28,0xe8);
              auVar52._8_4_ = 0xffffffff;
              auVar52._0_8_ = 0xffffffffffffffff;
              auVar52._12_4_ = 0xffffffff;
              auVar48 = (auVar17 | auVar22 & auVar48) ^ auVar52;
              auVar48 = packssdw(auVar48,auVar48);
              auVar48 = packsswb(auVar48,auVar48);
              if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar3[-0x77] = 0x7c;
              }
              auVar28 = auVar27 & auVar37 | auVar28;
              auVar48 = packssdw(auVar28,auVar28);
              auVar48 = packssdw(auVar48 ^ auVar52,auVar48 ^ auVar52);
              auVar48 = packsswb(auVar48,auVar48);
              if ((auVar48._8_2_ >> 8 & 1) != 0) {
                puVar3[-0x66] = 0x7c;
              }
              auVar48 = (auVar14 | auVar54) ^ auVar33;
              iVar42 = -(uint)(iVar16 < auVar48._0_4_);
              auVar46._4_4_ = -(uint)(iVar19 < auVar48._4_4_);
              iVar47 = -(uint)(iVar20 < auVar48._8_4_);
              auVar46._12_4_ = -(uint)(iVar21 < auVar48._12_4_);
              auVar29._4_4_ = iVar42;
              auVar29._0_4_ = iVar42;
              auVar29._8_4_ = iVar47;
              auVar29._12_4_ = iVar47;
              auVar38._4_4_ = -(uint)(auVar48._4_4_ == iVar19);
              auVar38._12_4_ = -(uint)(auVar48._12_4_ == iVar21);
              auVar38._0_4_ = auVar38._4_4_;
              auVar38._8_4_ = auVar38._12_4_;
              auVar46._0_4_ = auVar46._4_4_;
              auVar46._8_4_ = auVar46._12_4_;
              auVar48 = auVar38 & auVar29 | auVar46;
              auVar48 = packssdw(auVar48,auVar48);
              auVar48 = packssdw(auVar48 ^ auVar52,auVar48 ^ auVar52);
              auVar48 = packsswb(auVar48,auVar48);
              if ((auVar48 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar3[-0x55] = 0x7c;
              }
              auVar17 = pshufhw(auVar29,auVar29,0x84);
              auVar23 = pshufhw(auVar38,auVar38,0x84);
              auVar22 = pshufhw(auVar17,auVar46,0x84);
              auVar17 = (auVar22 | auVar23 & auVar17) ^ auVar52;
              auVar17 = packssdw(auVar17,auVar17);
              auVar17 = packsswb(auVar17,auVar17);
              if ((auVar17._10_2_ >> 8 & 1) != 0) {
                puVar3[-0x44] = 0x7c;
              }
              auVar17 = (auVar14 | auVar53) ^ auVar33;
              iVar42 = -(uint)(iVar16 < auVar17._0_4_);
              auVar31._4_4_ = -(uint)(iVar19 < auVar17._4_4_);
              iVar47 = -(uint)(iVar20 < auVar17._8_4_);
              auVar31._12_4_ = -(uint)(iVar21 < auVar17._12_4_);
              auVar39._4_4_ = iVar42;
              auVar39._0_4_ = iVar42;
              auVar39._8_4_ = iVar47;
              auVar39._12_4_ = iVar47;
              auVar48 = pshuflw(auVar48,auVar39,0xe8);
              auVar30._4_4_ = -(uint)(auVar17._4_4_ == iVar19);
              auVar30._12_4_ = -(uint)(auVar17._12_4_ == iVar21);
              auVar30._0_4_ = auVar30._4_4_;
              auVar30._8_4_ = auVar30._12_4_;
              auVar22 = pshuflw(auVar52,auVar30,0xe8);
              auVar31._0_4_ = auVar31._4_4_;
              auVar31._8_4_ = auVar31._12_4_;
              auVar17 = pshuflw(auVar48,auVar31,0xe8);
              in_XMM7._8_4_ = 0xffffffff;
              in_XMM7._0_8_ = 0xffffffffffffffff;
              in_XMM7._12_4_ = 0xffffffff;
              auVar48 = (auVar17 | auVar22 & auVar48) ^ in_XMM7;
              auVar48 = packssdw(auVar48,auVar48);
              auVar48 = packsswb(auVar48,auVar48);
              if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar3[-0x33] = 0x7c;
              }
              auVar31 = auVar30 & auVar39 | auVar31;
              auVar17 = packssdw(auVar31,auVar31);
              auVar17 = packssdw(auVar17 ^ in_XMM7,auVar17 ^ in_XMM7);
              auVar17 = packsswb(auVar17,auVar17);
              if ((auVar17._12_2_ >> 8 & 1) != 0) {
                puVar3[-0x22] = 0x7c;
              }
              auVar14 = (auVar14 | auVar43) ^ auVar33;
              auVar40._0_4_ = -(uint)(iVar16 < auVar14._0_4_);
              auVar40._4_4_ = -(uint)(iVar19 < auVar14._4_4_);
              auVar40._8_4_ = -(uint)(iVar20 < auVar14._8_4_);
              auVar40._12_4_ = -(uint)(iVar21 < auVar14._12_4_);
              auVar32._4_4_ = auVar40._0_4_;
              auVar32._0_4_ = auVar40._0_4_;
              auVar32._8_4_ = auVar40._8_4_;
              auVar32._12_4_ = auVar40._8_4_;
              auVar15._4_4_ = -(uint)(auVar14._4_4_ == iVar19);
              auVar15._12_4_ = -(uint)(auVar14._12_4_ == iVar21);
              auVar15._0_4_ = auVar15._4_4_;
              auVar15._8_4_ = auVar15._12_4_;
              auVar18._4_4_ = auVar40._4_4_;
              auVar18._0_4_ = auVar40._4_4_;
              auVar18._8_4_ = auVar40._12_4_;
              auVar18._12_4_ = auVar40._12_4_;
              auVar14 = packssdw(auVar40,auVar15 & auVar32 | auVar18);
              auVar14 = packssdw(auVar14 ^ in_XMM7,auVar14 ^ in_XMM7);
              auVar14 = packsswb(auVar14,auVar14);
              if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar3[-0x11] = 0x7c;
              }
              auVar22 = pshufhw(auVar32,auVar32,0x84);
              auVar14 = pshufhw(auVar15,auVar15,0x84);
              auVar17 = pshufhw(auVar18,auVar18,0x84);
              auVar14 = packssdw(auVar14 & auVar22,(auVar17 | auVar14 & auVar22) ^ in_XMM7);
              auVar14 = packsswb(auVar14,auVar14);
              if ((auVar14._14_2_ >> 8 & 1) != 0) {
                *puVar3 = 0x7c;
              }
              uVar7 = uVar7 + 0x10;
              puVar3 = puVar3 + 0x110;
            } while (((long)(int)~uVar2 + (long)(int)uVar9 + 0xfU & 0xfffffffffffffff0) != uVar7);
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar1 >> 1);
  }
  lVar5 = 0;
  do {
    lVar10 = -0x11;
    do {
      putchar((int)(char)puVar8[lVar10 + 0x11]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
    lVar5 = lVar5 + 1;
    putchar(10);
    puVar8 = puVar8 + 0x11;
  } while (lVar5 != 0x11);
  puts("\n\n=================================\n");
  return;
}

Assistant:

void Abc_GraphPathPrint5( int * pBuffer, Vec_Int_t * vEdges )
{
    char Box[17][17];
    int x, y;
    int e, nEdges = Vec_IntSize(vEdges)/2;
    for ( y = 0; y < 17; y++ )
    for ( x = 0; x < 17; x++ )
        if ( y % 4 == 0 && x % 4 == 0 )
            Box[y][x] = '*';
        else
            Box[y][x] = ' ';
    for ( e = 0; e < nEdges; e++ )
    {
        int * pNodes = Vec_IntEntryP(vEdges, 2*e);
        int y0 = 4*(pNodes[0]/5);
        int x0 = 4*(pNodes[0]%5);
        int y1 = 4*(pNodes[1]/5);
        int x1 = 4*(pNodes[1]%5);
        if ( !pBuffer[e] )
            continue;
        if ( y0 == y1 )
        {
            for ( x = x0+1; x < x1; x++ )
                Box[y0][x] = '-';
        }
        else if ( x0 == x1 )
        {
            for ( y = y0+1; y < y1; y++ )
                Box[y][x0] = '|';
        }
        else assert( 0 );
    }
    for ( y = 0; y < 17; y++, printf("\n") )
    for ( x = 0; x < 17; x++ )
        printf( "%c", Box[y][x] );
    printf( "\n\n=================================\n\n" );
}